

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::multiply_conv(bool add_to,tensor *dest,tensor *src1,tensor *src2)

{
  long lVar1;
  long lVar2;
  uint *puVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar9;
  ostream *poVar10;
  fatal_error *pfVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long c;
  ulong uVar18;
  long lVar19;
  long lVar20;
  string local_1c8;
  ostringstream dlib_o_out;
  uint auStack_190 [88];
  
  iVar8 = (*dest->_vptr_tensor[3])(dest);
  lVar14 = CONCAT44(extraout_var,iVar8);
  iVar8 = (*src1->_vptr_tensor[2])(src1);
  lVar19 = CONCAT44(extraout_var_00,iVar8);
  iVar8 = (*src2->_vptr_tensor[2])(src2);
  lVar20 = CONCAT44(extraout_var_01,iVar8);
  bVar7 = have_same_dimensions(dest,src1);
  if (bVar7) {
    if (((src2->m_n != 1) || (src2->m_nr != 1)) || ((src2->m_nc != 1 || (src2->m_k != src1->m_k))))
    {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
      poVar10 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x5e);
      std::operator<<(poVar10,".\n");
      poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
      poVar10 = std::operator<<(poVar10,
                                "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                               );
      std::operator<<(poVar10,".\n");
      poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
      poVar10 = std::operator<<(poVar10,
                                "void dlib::cpu::multiply_conv(bool, tensor &, const tensor &, const tensor &)"
                               );
      std::operator<<(poVar10,".\n\n");
      poVar10 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
      poVar10 = std::operator<<(poVar10,
                                "src2.num_samples() == 1 && src2.nr() == 1 && src2.nc() == 1 && src2.k() == src1.k()"
                               );
      std::operator<<(poVar10,".\n");
      puVar3 = (uint *)((long)auStack_190 + *(long *)(_dlib_o_out + -0x18));
      *puVar3 = *puVar3 | 1;
      poVar10 = std::operator<<((ostream *)&dlib_o_out,"");
      std::operator<<(poVar10,"\n");
      pfVar11 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar11,EBROKEN_ASSERT,&local_1c8);
      __cxa_throw(pfVar11,&fatal_error::typeinfo,error::~error);
    }
    uVar9 = ~(dest->m_k >> 0x3f) & dest->m_k;
    uVar12 = ~(dest->m_n >> 0x3f) & dest->m_n;
    if (add_to) {
      for (uVar13 = 0; uVar13 != uVar12; uVar13 = uVar13 + 1) {
        uVar4 = dest->m_nr;
        for (uVar15 = 0; uVar15 != uVar9; uVar15 = uVar15 + 1) {
          uVar5 = dest->m_nc;
          for (uVar16 = 0; uVar16 != (~((long)uVar4 >> 0x3f) & uVar4); uVar16 = uVar16 + 1) {
            lVar17 = 0;
            for (uVar18 = 0; (~((long)uVar5 >> 0x3f) & uVar5) != uVar18; uVar18 = uVar18 + 1) {
              lVar17 = lVar17 + -4;
              auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar20 + uVar15 * 4)),
                                       ZEXT416(*(uint *)(lVar19 + uVar18 * 4)),
                                       ZEXT416(*(uint *)(lVar14 + uVar18 * 4)));
              *(int *)(lVar14 + uVar18 * 4) = auVar6._0_4_;
            }
            lVar14 = lVar14 - lVar17;
            lVar19 = lVar19 - lVar17;
          }
        }
      }
    }
    else {
      for (uVar13 = 0; uVar13 != uVar12; uVar13 = uVar13 + 1) {
        uVar4 = dest->m_nr;
        for (uVar15 = 0; uVar15 != uVar9; uVar15 = uVar15 + 1) {
          uVar5 = dest->m_nc;
          for (uVar16 = 0; uVar16 != (~((long)uVar4 >> 0x3f) & uVar4); uVar16 = uVar16 + 1) {
            lVar17 = 0;
            for (uVar18 = 0; (~((long)uVar5 >> 0x3f) & uVar5) != uVar18; uVar18 = uVar18 + 1) {
              lVar17 = lVar17 + -4;
              *(float *)(lVar14 + uVar18 * 4) =
                   *(float *)(lVar19 + uVar18 * 4) * *(float *)(lVar20 + uVar15 * 4);
            }
            lVar14 = lVar14 - lVar17;
            lVar19 = lVar19 - lVar17;
          }
        }
      }
    }
  }
  else {
    bVar7 = have_same_dimensions(src1,src2);
    if (!bVar7) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
      poVar10 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x83);
      std::operator<<(poVar10,".\n");
      poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
      poVar10 = std::operator<<(poVar10,
                                "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                               );
      std::operator<<(poVar10,".\n");
      poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
      poVar10 = std::operator<<(poVar10,
                                "void dlib::cpu::multiply_conv(bool, tensor &, const tensor &, const tensor &)"
                               );
      std::operator<<(poVar10,".\n\n");
      poVar10 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
      poVar10 = std::operator<<(poVar10,"have_same_dimensions(src1,src2)");
      std::operator<<(poVar10,".\n");
      puVar3 = (uint *)((long)auStack_190 + *(long *)(_dlib_o_out + -0x18));
      *puVar3 = *puVar3 | 1;
      poVar10 = std::operator<<((ostream *)&dlib_o_out,"");
      std::operator<<(poVar10,"\n");
      pfVar11 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar11,EBROKEN_ASSERT,&local_1c8);
      __cxa_throw(pfVar11,&fatal_error::typeinfo,error::~error);
    }
    if ((((dest->m_n != 1) || (dest->m_nr != 1)) || (dest->m_nc != 1)) ||
       (uVar9 = dest->m_k, uVar9 != src1->m_k)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
      poVar10 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x84);
      std::operator<<(poVar10,".\n");
      poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
      poVar10 = std::operator<<(poVar10,
                                "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                               );
      std::operator<<(poVar10,".\n");
      poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
      poVar10 = std::operator<<(poVar10,
                                "void dlib::cpu::multiply_conv(bool, tensor &, const tensor &, const tensor &)"
                               );
      std::operator<<(poVar10,".\n\n");
      poVar10 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
      poVar10 = std::operator<<(poVar10,
                                "dest.num_samples() == 1 && dest.nr() == 1 && dest.nc() == 1 && dest.k() == src1.k()"
                               );
      std::operator<<(poVar10,".\n");
      puVar3 = (uint *)((long)auStack_190 + *(long *)(_dlib_o_out + -0x18));
      *puVar3 = *puVar3 | 1;
      poVar10 = std::operator<<((ostream *)&dlib_o_out,"");
      std::operator<<(poVar10,"\n");
      pfVar11 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar11,EBROKEN_ASSERT,&local_1c8);
      __cxa_throw(pfVar11,&fatal_error::typeinfo,error::~error);
    }
    uVar9 = ~((long)uVar9 >> 0x3f) & uVar9;
    if (!add_to) {
      for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
        *(undefined4 *)(lVar14 + uVar12 * 4) = 0;
      }
    }
    uVar12 = src1->m_n;
    for (uVar13 = 0; uVar13 != (~((long)uVar12 >> 0x3f) & uVar12); uVar13 = uVar13 + 1) {
      uVar4 = src1->m_nr;
      for (uVar15 = 0; uVar15 != uVar9; uVar15 = uVar15 + 1) {
        uVar5 = src1->m_nc;
        for (uVar16 = 0; uVar16 != (~((long)uVar4 >> 0x3f) & uVar4); uVar16 = uVar16 + 1) {
          lVar17 = 0;
          uVar18 = 0;
          while ((~((long)uVar5 >> 0x3f) & uVar5) != uVar18) {
            lVar1 = uVar18 * 4;
            lVar2 = uVar18 * 4;
            uVar18 = uVar18 + 1;
            lVar17 = lVar17 + -4;
            auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar20 + lVar2)),
                                     ZEXT416(*(uint *)(lVar19 + lVar1)),
                                     ZEXT416(*(uint *)(lVar14 + uVar15 * 4)));
            *(int *)(lVar14 + uVar15 * 4) = auVar6._0_4_;
          }
          lVar19 = lVar19 - lVar17;
          lVar20 = lVar20 - lVar17;
        }
      }
    }
  }
  return;
}

Assistant:

void multiply_conv (
            bool add_to,
            tensor& dest,
            const tensor& src1,
            const tensor& src2
        )
        {
            auto d = dest.host();
            auto s1 = src1.host();
            auto s2 = src2.host();
            if (have_same_dimensions(dest,src1))
            {
                DLIB_CASSERT(src2.num_samples() == 1 && src2.nr() == 1 && src2.nc() == 1 && src2.k() == src1.k());

                if (add_to)
                {
                    for (long n = 0; n < dest.num_samples(); ++n)
                    {
                        for (long k = 0; k < dest.k(); ++k)
                        {
                            for (long r = 0; r < dest.nr(); ++r)
                            {
                                for (long c = 0; c < dest.nc(); ++c)
                                {
                                    *d++ += (*s1++)*s2[k];
                                }
                            }
                        }
                    }
                }
                else
                {
                    for (long n = 0; n < dest.num_samples(); ++n)
                    {
                        for (long k = 0; k < dest.k(); ++k)
                        {
                            for (long r = 0; r < dest.nr(); ++r)
                            {
                                for (long c = 0; c < dest.nc(); ++c)
                                {
                                    *d++ = (*s1++)*s2[k];
                                }
                            }
                        }
                    }
                }
            }
            else
            {
                DLIB_CASSERT(have_same_dimensions(src1,src2));
                DLIB_CASSERT(dest.num_samples() == 1 && dest.nr() == 1 && dest.nc() == 1 && dest.k() == src1.k());

                if (!add_to)
                {
                    for (long k = 0; k < src1.k(); ++k)
                        d[k] = 0;
                }

                for (long n = 0; n < src1.num_samples(); ++n)
                {
                    for (long k = 0; k < src1.k(); ++k)
                    {
                        for (long r = 0; r < src1.nr(); ++r)
                        {
                            for (long c = 0; c < src1.nc(); ++c)
                            {
                                d[k] += (*s1++)*(*s2++);
                            }
                        }
                    }
                }
            }
        }